

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpkeyhashtable.h
# Opt level: O0

bool __thiscall
jrtplib::
RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
::HasElement(RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
             *this,uint *k)

{
  int iVar1;
  uint *puVar2;
  HashElement *local_30;
  HashElement *tmp;
  bool found;
  int index;
  uint *k_local;
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
  *this_local;
  
  iVar1 = RTPSources_GetHashIndex::GetIndex(k);
  if (iVar1 < 0x207d) {
    local_30 = this->table[iVar1];
    this_local._7_1_ = false;
    while (this_local._7_1_ == false && local_30 != (HashElement *)0x0) {
      puVar2 = HashElement::GetKey(local_30);
      if (*puVar2 == *k) {
        this_local._7_1_ = true;
      }
      else {
        local_30 = local_30->hashnext;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool RTPKeyHashTable<Key,Element,GetIndex,hashsize>::HasElement(const Key &k)
{
	int index;
	bool found;
	HashElement *tmp;
	
	index = GetIndex::GetIndex(k);
	if (index >= hashsize)
		return false;
	
	tmp = table[index]; 
	found = false;
	while(!found && tmp != 0)
	{
		if (tmp->GetKey() == k)
			found = true;
		else
			tmp = tmp->hashnext;
	}
	return found;
}